

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_column_data_ref.cpp
# Opt level: O2

unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>,_true> __thiscall
duckdb::Binder::Bind(Binder *this,ColumnDataRef *ref)

{
  type args;
  idx_t iVar1;
  pointer pBVar2;
  long in_RDX;
  vector<duckdb::LogicalType,_true> types;
  unique_ptr<duckdb::BoundColumnDataRef,_std::default_delete<duckdb::BoundColumnDataRef>,_true>
  local_40;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_38;
  
  args = shared_ptr<duckdb::ColumnDataCollection,_true>::operator*
                   ((shared_ptr<duckdb::ColumnDataCollection,_true> *)(in_RDX + 0x80));
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_38,
             &(args->types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>)
  ;
  make_uniq<duckdb::BoundColumnDataRef,duckdb::ColumnDataCollection&>((duckdb *)&local_40,args);
  iVar1 = GenerateTableIndex((Binder *)ref);
  pBVar2 = unique_ptr<duckdb::BoundColumnDataRef,_std::default_delete<duckdb::BoundColumnDataRef>,_true>
           ::operator->(&local_40);
  pBVar2->bind_index = iVar1;
  pBVar2 = unique_ptr<duckdb::BoundColumnDataRef,_std::default_delete<duckdb::BoundColumnDataRef>,_true>
           ::operator->(&local_40);
  BindContext::AddGenericBinding
            ((BindContext *)
             &(ref->collection).internal.
              super___shared_ptr<duckdb::ColumnDataCollection,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,pBVar2->bind_index,(string *)(in_RDX + 0x10),
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              *)(in_RDX + 0x68),(vector<duckdb::LogicalType,_true> *)&local_38);
  (this->super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
  super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       local_40.
       super_unique_ptr<duckdb::BoundColumnDataRef,_std::default_delete<duckdb::BoundColumnDataRef>_>
       ._M_t.
       super___uniq_ptr_impl<duckdb::BoundColumnDataRef,_std::default_delete<duckdb::BoundColumnDataRef>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::BoundColumnDataRef_*,_std::default_delete<duckdb::BoundColumnDataRef>_>
       .super__Head_base<0UL,_duckdb::BoundColumnDataRef_*,_false>._M_head_impl;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_38);
  return (unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>_>)
         (unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>_>)this;
}

Assistant:

unique_ptr<BoundTableRef> Binder::Bind(ColumnDataRef &ref) {
	auto &collection = *ref.collection;
	auto types = collection.Types();
	auto result = make_uniq<BoundColumnDataRef>(collection);
	result->bind_index = GenerateTableIndex();
	bind_context.AddGenericBinding(result->bind_index, ref.alias, ref.expected_names, types);
	return unique_ptr_cast<BoundColumnDataRef, BoundTableRef>(std::move(result));
}